

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

int SUNDlsMat_denseORMQR
              (realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *vn,realtype *vm,
              realtype *v)

{
  double dVar1;
  realtype *prVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  realtype *prVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  realtype rVar10;
  
  uVar5 = 0;
  uVar7 = 0;
  if (0 < n) {
    uVar7 = (ulong)(uint)n;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    vm[uVar5] = vn[uVar5];
  }
  lVar3 = (long)n;
  for (lVar4 = lVar3; lVar4 < m; lVar4 = lVar4 + 1) {
    vm[lVar4] = 0.0;
  }
  lVar4 = lVar3 * 8;
  prVar6 = vm + lVar3;
  while (0 < lVar3) {
    lVar3 = lVar3 + -1;
    prVar2 = a[lVar3];
    *v = 1.0;
    rVar10 = vm[lVar3];
    lVar9 = m - lVar3;
    for (lVar8 = 1; lVar8 < lVar9; lVar8 = lVar8 + 1) {
      dVar1 = *(double *)((long)prVar2 + lVar8 * 8 + lVar4 + -8);
      v[lVar8] = dVar1;
      rVar10 = rVar10 + dVar1 * prVar6[lVar8 + -1];
    }
    dVar1 = beta[lVar3];
    for (lVar8 = 0; lVar8 < lVar9; lVar8 = lVar8 + 1) {
      prVar6[lVar8 + -1] = v[lVar8] * -rVar10 * dVar1 + prVar6[lVar8 + -1];
    }
    lVar4 = lVar4 + -8;
    prVar6 = prVar6 + -1;
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseORMQR(realtype **a, sunindextype m, sunindextype n, realtype *beta,
                         realtype *vn, realtype *vm, realtype *v)
{
  realtype *col_j, s;
  sunindextype i, j;

  /* Initialize vm */
  for(i=0; i<n; i++) vm[i] = vn[i];
  for(i=n; i<m; i++) vm[i] = ZERO;

  /* Accumulate (backwards) corrections into vm */
  for(j=n-1; j>=0; j--) {

    col_j = a[j];

    v[0] = ONE;
    s = vm[j];
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*vm[i+j];
    }
    s *= beta[j];

    for(i=0; i<m-j; i++) vm[i+j] -= s * v[i];

  }

  return(0);
}